

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O0

void __thiscall CMU462::OSDText::del_line(OSDText *this,int line_id)

{
  bool bVar1;
  pointer pOVar2;
  const_iterator local_30;
  __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
  local_28;
  __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
  local_20;
  iterator it;
  int line_id_local;
  OSDText *this_local;
  
  it._M_current._4_4_ = line_id;
  local_20._M_current =
       (OSDLine *)
       std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::begin(&this->lines);
  while( true ) {
    local_28._M_current =
         (OSDLine *)
         std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::end(&this->lines);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) {
      return;
    }
    pOVar2 = __gnu_cxx::
             __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
             ::operator->(&local_20);
    if (pOVar2->id == it._M_current._4_4_) break;
    __gnu_cxx::
    __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
    ::operator++(&local_20);
  }
  __gnu_cxx::
  __normal_iterator<CMU462::OSDLine_const*,std::vector<CMU462::OSDLine,std::allocator<CMU462::OSDLine>>>
  ::__normal_iterator<CMU462::OSDLine*>
            ((__normal_iterator<CMU462::OSDLine_const*,std::vector<CMU462::OSDLine,std::allocator<CMU462::OSDLine>>>
              *)&local_30,&local_20);
  std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::erase(&this->lines,local_30);
  return;
}

Assistant:

void OSDText::del_line(int line_id) {
  vector<OSDLine>::iterator it = lines.begin();
  while(it != lines.end()) {
    if(it->id == line_id) {
      lines.erase(it);
      break;
    }
    ++it;
  }
}